

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iobase.cpp
# Opt level: O1

void __thiscall CIOOutputFile::next(CIOOutputFile *this,uint8_t *ptr,uint32_t length)

{
  size_t sVar1;
  
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    sVar1 = fwrite(ptr,(ulong)length,1,(FILE *)this->m_fp);
    if ((int)sVar1 != 1) {
      (*(this->super_CIOBaseWrite).super_CIOBase._vptr_CIOBase[3])(this);
      printf("I could not write to %s.\n",
             (((this->super_CIOBaseWrite).super_CIOBase.m_parameters)->m_filename)._M_dataplus._M_p)
      ;
      return;
    }
  }
  return;
}

Assistant:

void CIOOutputFile::next(const uint8_t* ptr, uint32_t length) {
    if ( m_fp ) {
        int result = fwrite(ptr, length, 1, m_fp);
        if ( result != 1) {
            stop();
            printf("I could not write to %s.\n", parameters().m_filename.c_str());            
        }
    }
}